

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O1

void multi_kv_rollback_test(uint8_t opt,size_t chunksize)

{
  fdb_status fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  fdb_config *pfVar8;
  code *fconfig;
  char **kvs_names_00;
  fdb_config *pfVar9;
  char *pcVar10;
  undefined7 in_register_00000039;
  fdb_config *unaff_R12;
  fdb_config *doc_00;
  char *pcVar11;
  fdb_doc *doc_01;
  char *unaff_R13;
  fdb_custom_cmp_variable *functions_00;
  fdb_config *pfVar12;
  long lVar13;
  fdb_doc *doc;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_seqnum_t seq3;
  fdb_seqnum_t seq2;
  fdb_seqnum_t seq1;
  fdb_custom_cmp_variable functions [3];
  char *kvs_names [3];
  char value [256];
  char key [256];
  timeval __test_begin;
  timeval tStackY_1520;
  fdb_config fStackY_1510;
  fdb_file_handle *apfStackY_1418 [100];
  fdb_config *pfStackY_10f8;
  fdb_custom_cmp_variable *pp_StackY_10f0;
  fdb_config *pfStackY_10e8;
  fdb_file_handle *pfStack_10d0;
  fdb_config *pfStack_10c8;
  fdb_kvs_handle *pfStack_10c0;
  fdb_kvs_config fStack_10b8;
  timeval tStack_10a0;
  char acStack_1090 [264];
  fdb_config fStack_f88;
  fdb_custom_cmp_variable ap_Stack_e90 [33];
  char **ppcStack_d88;
  fdb_doc *pfStack_d80;
  fdb_config *pfStack_d78;
  fdb_custom_cmp_variable *pp_Stack_d70;
  fdb_config *pfStack_d68;
  fdb_config *pfStack_d60;
  undefined1 auStack_d48 [24];
  fdb_kvs_handle *pfStack_d30;
  fdb_kvs_handle *pfStack_d28;
  fdb_kvs_config fStack_d20;
  fdb_custom_cmp_variable p_Stack_d08;
  code *pcStack_d00;
  code *pcStack_cf8;
  char *pcStack_ce8;
  char *pcStack_ce0;
  char *pcStack_cd8;
  timeval tStack_cc8;
  fdb_config fStack_cb8;
  fdb_config fStack_bb0;
  fdb_custom_cmp_variable ap_Stack_ab8 [33];
  fdb_config *pfStack_9b0;
  fdb_config *pfStack_9a8;
  fdb_config *pfStack_9a0;
  fdb_config *pfStack_998;
  fdb_config *pfStack_990;
  fdb_config *pfStack_988;
  undefined1 auStack_978 [24];
  fdb_kvs_handle *pfStack_960;
  fdb_kvs_handle *pfStack_958;
  fdb_iterator *pfStack_950;
  fdb_kvs_config fStack_948;
  fdb_config fStack_930;
  timeval tStack_830;
  fdb_config fStack_820;
  fdb_config fStack_718;
  fdb_doc afStack_620 [3];
  fdb_doc afStack_520 [3];
  char *pcStack_418;
  fdb_config *pfStack_410;
  fdb_config *pfStack_408;
  fdb_config *pfStack_400;
  fdb_config *pfStack_3f8;
  fdb_config *pfStack_3f0;
  undefined1 local_3d8 [24];
  fdb_file_handle *local_3c0;
  fdb_kvs_handle *local_3b8;
  uint local_3ac;
  fdb_seqnum_t local_3a8;
  fdb_seqnum_t local_3a0;
  fdb_seqnum_t local_398;
  fdb_kvs_config local_390;
  fdb_custom_cmp_variable local_378;
  code *pcStack_370;
  code *local_368;
  char *local_358;
  char *pcStack_350;
  char *local_348;
  fdb_config local_338;
  fdb_config local_238;
  timeval local_138;
  fdb_config local_128;
  
  pcVar5 = (char *)(CONCAT71(in_register_00000039,opt) & 0xffffffff);
  pfVar12 = (fdb_config *)0x0;
  pfStack_3f0 = (fdb_config *)0x113ccc;
  gettimeofday(&local_138,(__timezone_ptr_t)0x0);
  local_348 = "kv2";
  local_358 = (char *)0x0;
  pcStack_350 = "kv1";
  local_368 = _multi_kv_test_keycmp;
  local_378 = _multi_kv_test_keycmp;
  pcStack_370 = _multi_kv_test_keycmp;
  local_338.wal_threshold._0_1_ = '_';
  local_338.wal_threshold._1_1_ = 't';
  local_338.wal_threshold._2_1_ = 'e';
  local_338.wal_threshold._3_1_ = 's';
  local_338.wal_threshold._4_3_ = 0x2a74;
  local_338._0_8_ = 0x202066722d206d72;
  local_338.buffercache_size._0_1_ = 'm';
  local_338.buffercache_size._1_1_ = 'u';
  local_338.buffercache_size._2_1_ = 'l';
  local_338.buffercache_size._3_1_ = 't';
  local_338.buffercache_size._4_1_ = 'i';
  local_338.buffercache_size._5_1_ = '_';
  local_338.buffercache_size._6_1_ = 'k';
  local_338.buffercache_size._7_1_ = 'v';
  pfStack_3f0 = (fdb_config *)0x113d2a;
  system((char *)&local_338);
  pfStack_3f0 = (fdb_config *)0x113d2f;
  memleak_start();
  pcVar10 = (char *)&local_128;
  pfStack_3f0 = (fdb_config *)0x113d3f;
  fdb_get_default_config();
  pfStack_3f0 = (fdb_config *)0x113d49;
  fdb_get_default_kvs_config();
  local_128.seqtree_opt = '\x01';
  local_128.chunksize = (uint16_t)chunksize;
  local_128.multi_kv_instances = true;
  local_128.wal_threshold = 1000;
  local_128.buffercache_size = 0;
  local_128.block_reusing_threshold = 0;
  local_3ac = (uint)CONCAT71(in_register_00000039,opt);
  pcVar11 = (char *)unaff_R12;
  pcVar7 = (char *)chunksize;
  if ((opt & 1) != 0) {
LAB_00113d95:
    pfStack_3f0 = (fdb_config *)0x113dc8;
    fVar1 = fdb_open_custom_cmp(&local_3c0,"./multi_kv_test",&local_128,3,&local_358,&local_378,
                                (void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113dd0;
    goto LAB_0011513d;
  }
  pfStack_3f0 = (fdb_config *)0x113d8c;
  fVar1 = fdb_open(&local_3c0,"./multi_kv_test",&local_128);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pfStack_3f0 = (fdb_config *)0x113d95;
    multi_kv_rollback_test();
    goto LAB_00113d95;
  }
LAB_00113dd0:
  pfStack_3f0 = (fdb_config *)0x113de6;
  fVar1 = fdb_kvs_open(local_3c0,&local_3b8,(char *)0x0,&local_390);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150ed;
  pfStack_3f0 = (fdb_config *)0x113e09;
  fVar1 = fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 0x10),"kv1",&local_390);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150f2;
  pfStack_3f0 = (fdb_config *)0x113e2c;
  fVar1 = fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 8),"kv2",&local_390);
  pfVar9 = (fdb_config *)pcVar10;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150f7;
  pcVar7 = "value%08d(%s)";
  pcVar5 = (char *)&local_338;
  pfVar9 = (fdb_config *)0x0;
  do {
    pfVar12 = (fdb_config *)local_3d8;
    pfVar8 = &local_238;
    iVar3 = (int)pfVar9;
    pfStack_3f0 = (fdb_config *)0x113e67;
    sprintf((char *)pfVar8,"key%06d",pfVar9);
    pfStack_3f0 = (fdb_config *)0x113e7e;
    sprintf(pcVar5,"value%08d(%s)",pfVar9);
    pfStack_3f0 = (fdb_config *)0x113e86;
    sVar4 = strlen((char *)pfVar8);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x113e92;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x113eaf;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar8,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x113ebe;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)pfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00114f92:
      pfStack_3f0 = (fdb_config *)0x114f97;
      multi_kv_rollback_test();
LAB_00114f97:
      pfStack_3f0 = (fdb_config *)0x114f9c;
      multi_kv_rollback_test();
      goto LAB_00114f9c;
    }
    pfStack_3f0 = (fdb_config *)0x113ed0;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x113ee7;
    sprintf(pcVar5,"value%08d(%s)",pfVar9);
    pfStack_3f0 = (fdb_config *)0x113eef;
    sVar4 = strlen((char *)pfVar8);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x113efb;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x113f18;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar8,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x113f27;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_3f0 = (fdb_config *)0x114f92;
      multi_kv_rollback_test();
      goto LAB_00114f92;
    }
    if ((int)((ulong)pfVar9 / 0xf) * 0xf == iVar3) {
      pfStack_3f0 = (fdb_config *)0x113f5c;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150c5;
    }
    pfStack_3f0 = (fdb_config *)0x113f6e;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x113f85;
    sprintf(pcVar5,"value%08d(%s)",pfVar9);
    pfStack_3f0 = (fdb_config *)0x113f98;
    sVar4 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x113fa4;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x113fc6;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x113fd5;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar8 = pfVar9;
    pfVar12 = (fdb_config *)pcVar5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f97;
    iVar2 = (int)((ulong)((long)pfVar9 * 0x2f684bdb) >> 0x20);
    if ((((uint)(iVar3 - iVar2) >> 1) + iVar2 >> 4) * 0x1b == iVar3) {
      pfStack_3f0 = (fdb_config *)0x11400e;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150ca;
    }
    pfStack_3f0 = (fdb_config *)0x114020;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfVar9 = (fdb_config *)(ulong)(iVar3 + 1U);
    pfVar12 = (fdb_config *)local_3d8;
    pcVar11 = (char *)&local_238;
  } while (iVar3 + 1U != 100);
  pfStack_3f0 = (fdb_config *)0x114049;
  fVar1 = fdb_commit(local_3c0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150fc;
  pfStack_3f0 = (fdb_config *)0x114060;
  fVar1 = fdb_get_kvs_seqnum((fdb_kvs_handle *)local_3d8._16_8_,&local_398);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115101;
  pcVar7 = "value%08d(%s)";
  pcVar5 = (char *)&local_338;
  pfVar9 = (fdb_config *)0x0;
  do {
    pfVar12 = (fdb_config *)local_3d8;
    pfVar8 = &local_238;
    iVar3 = (int)pfVar9;
    pfStack_3f0 = (fdb_config *)0x11409b;
    sprintf((char *)pfVar8,"key%06d",pfVar9);
    pfStack_3f0 = (fdb_config *)0x1140b2;
    sprintf(pcVar5,"value%08d(%s)",pfVar9);
    pfStack_3f0 = (fdb_config *)0x1140ba;
    sVar4 = strlen((char *)pfVar8);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x1140c6;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x1140e3;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar8,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x1140f2;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)pfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fa1;
    pfStack_3f0 = (fdb_config *)0x114104;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x11411b;
    sprintf(pcVar5,"value%08d(%s)",pfVar9);
    pfStack_3f0 = (fdb_config *)0x114123;
    sVar4 = strlen((char *)pfVar8);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x11412f;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x11414c;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar8,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x11415b;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f9c;
    if ((int)((ulong)pfVar9 / 0xf) * 0xf == iVar3) {
      pfStack_3f0 = (fdb_config *)0x114190;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150cf;
    }
    pfStack_3f0 = (fdb_config *)0x1141a2;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x1141b9;
    sprintf(pcVar5,"value%08d(%s)",pfVar9);
    pfStack_3f0 = (fdb_config *)0x1141cc;
    sVar4 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x1141d8;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x1141fa;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x114209;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar12 = (fdb_config *)pcVar5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fa6;
    iVar2 = (int)((ulong)((long)pfVar9 * 0x2f684bdb) >> 0x20);
    if ((((uint)(iVar3 - iVar2) >> 1) + iVar2 >> 4) * 0x1b == iVar3) {
      pfStack_3f0 = (fdb_config *)0x114242;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      pfVar8 = pfVar9;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150d4;
    }
    pfStack_3f0 = (fdb_config *)0x114254;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfVar9 = (fdb_config *)(ulong)(iVar3 + 1U);
    pfVar12 = (fdb_config *)local_3d8;
    pcVar11 = (char *)&local_238;
  } while (iVar3 + 1U != 100);
  pfStack_3f0 = (fdb_config *)0x11427d;
  fVar1 = fdb_commit(local_3c0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115106;
  pfStack_3f0 = (fdb_config *)0x114294;
  fVar1 = fdb_get_kvs_seqnum(local_3b8,&local_3a0);
  pfVar8 = pfVar9;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011510b;
  pcVar7 = "value%08d(%s)";
  pcVar5 = (char *)&local_338;
  pfVar8 = (fdb_config *)0x0;
  do {
    pfVar12 = (fdb_config *)local_3d8;
    pfVar9 = &local_238;
    iVar3 = (int)pfVar8;
    pfStack_3f0 = (fdb_config *)0x1142cf;
    sprintf((char *)pfVar9,"key%06d",pfVar8);
    pfStack_3f0 = (fdb_config *)0x1142e6;
    sprintf(pcVar5,"value%08d(%s)",pfVar8);
    pfStack_3f0 = (fdb_config *)0x1142ee;
    sVar4 = strlen((char *)pfVar9);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x1142fa;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x114317;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar9,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x114326;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)pfVar8;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fb0;
    pfStack_3f0 = (fdb_config *)0x114338;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x11434f;
    sprintf(pcVar5,"value%08d(%s)",pfVar8);
    pfStack_3f0 = (fdb_config *)0x114357;
    sVar4 = strlen((char *)pfVar9);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x114363;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x114380;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar9,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x11438f;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fab;
    if ((int)((ulong)pfVar8 / 0xf) * 0xf == iVar3) {
      pfStack_3f0 = (fdb_config *)0x1143c4;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150d9;
    }
    pfStack_3f0 = (fdb_config *)0x1143d6;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x1143ed;
    sprintf(pcVar5,"value%08d(%s)",pfVar8);
    pfStack_3f0 = (fdb_config *)0x114400;
    sVar4 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x11440c;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x11442e;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x11443d;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar12 = (fdb_config *)pcVar5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fb5;
    iVar2 = (int)((ulong)((long)pfVar8 * 0x2f684bdb) >> 0x20);
    if ((((uint)(iVar3 - iVar2) >> 1) + iVar2 >> 4) * 0x1b == iVar3) {
      pfStack_3f0 = (fdb_config *)0x114476;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      unaff_R12 = pfVar8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150de;
    }
    pfStack_3f0 = (fdb_config *)0x114488;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfVar8 = (fdb_config *)(ulong)(iVar3 + 1U);
    pfVar12 = (fdb_config *)local_3d8;
    pcVar11 = (char *)&local_238;
  } while (iVar3 + 1U != 100);
  pfStack_3f0 = (fdb_config *)0x1144ae;
  fVar1 = fdb_commit(local_3c0,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115110;
  pfStack_3f0 = (fdb_config *)0x1144c5;
  fVar1 = fdb_get_kvs_seqnum((fdb_kvs_handle *)local_3d8._8_8_,&local_3a8);
  unaff_R12 = pfVar8;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115115;
  pcVar7 = "value%08d(%s)";
  pcVar5 = (char *)&local_338;
  unaff_R12 = (fdb_config *)0x0;
  do {
    pfVar12 = (fdb_config *)local_3d8;
    pfVar8 = &local_238;
    iVar3 = (int)unaff_R12;
    pfStack_3f0 = (fdb_config *)0x114500;
    sprintf((char *)pfVar8,"key%06d",unaff_R12);
    pfStack_3f0 = (fdb_config *)0x114517;
    sprintf(pcVar5,"value%08d(%s)",unaff_R12);
    pfStack_3f0 = (fdb_config *)0x11451f;
    sVar4 = strlen((char *)pfVar8);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x11452b;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x114548;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar8,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x114557;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)unaff_R12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fbf;
    pfStack_3f0 = (fdb_config *)0x114569;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x114580;
    sprintf(pcVar5,"value%08d(%s)",unaff_R12);
    pfStack_3f0 = (fdb_config *)0x114588;
    sVar4 = strlen((char *)pfVar8);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x114594;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x1145b1;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar8,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x1145c0;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fba;
    if ((int)((ulong)unaff_R12 / 0xf) * 0xf == iVar3) {
      pfStack_3f0 = (fdb_config *)0x1145f5;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150e3;
    }
    pfStack_3f0 = (fdb_config *)0x114607;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x11461e;
    sprintf(pcVar5,"value%08d(%s)",unaff_R12);
    pfStack_3f0 = (fdb_config *)0x114631;
    sVar4 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_3f0 = (fdb_config *)0x11463d;
    sVar4 = strlen(pcVar5);
    pfStack_3f0 = (fdb_config *)0x11465f;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar5,sVar4 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x11466e;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar12 = (fdb_config *)pcVar5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fc4;
    iVar2 = (int)((ulong)((long)unaff_R12 * 0x2f684bdb) >> 0x20);
    if ((((uint)(iVar3 - iVar2) >> 1) + iVar2 >> 4) * 0x1b == iVar3) {
      pfStack_3f0 = (fdb_config *)0x1146a7;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150e8;
    }
    pfStack_3f0 = (fdb_config *)0x1146b9;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    unaff_R12 = (fdb_config *)(ulong)(iVar3 + 1U);
    pfVar12 = (fdb_config *)local_3d8;
    pcVar11 = (char *)&local_238;
  } while (iVar3 + 1U != 100);
  pfStack_3f0 = (fdb_config *)0x1146df;
  fVar1 = fdb_commit(local_3c0,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011511a;
  pfStack_3f0 = (fdb_config *)0x1146f6;
  fVar1 = fdb_rollback((fdb_kvs_handle **)(local_3d8 + 0x10),local_398);
  pcVar10 = (char *)unaff_R12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011511f;
  pcVar10 = (char *)&local_238;
  unaff_R13 = (char *)&local_338;
  pcVar5 = local_3d8;
  pcVar7 = (char *)0x0;
  do {
    pfStack_3f0 = (fdb_config *)0x114728;
    sprintf(pcVar10,"key%06d",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114742;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x11474a;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x114769;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114778;
    fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
    unaff_R12 = (fdb_config *)local_3d8._0_8_;
    pfVar9 = (fdb_config *)pcVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fd9;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11479a;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00114fc9;
    pfStack_3f0 = (fdb_config *)0x1147aa;
    fdb_doc_free((fdb_doc *)unaff_R12);
    pfStack_3f0 = (fdb_config *)0x1147c4;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x1147cc;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x1147eb;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x1147fa;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar9 = (fdb_config *)local_3d8._0_8_;
    pcVar11 = (char *)unaff_R12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fee;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11481c;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00114fde;
    pfStack_3f0 = (fdb_config *)0x11482c;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfStack_3f0 = (fdb_config *)0x114846;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x11484e;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x11486d;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x11487c;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pcVar11 = (char *)local_3d8._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115003;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11489e;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00114ff3;
    pfStack_3f0 = (fdb_config *)0x1148ae;
    fdb_doc_free((fdb_doc *)pcVar11);
    uVar6 = (int)pcVar7 + 1;
    pcVar7 = (char *)(ulong)uVar6;
  } while (uVar6 != 100);
  pfStack_3f0 = (fdb_config *)0x1148c8;
  fVar1 = fdb_rollback(&local_3b8,local_3a0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115124;
  pcVar10 = (char *)&local_238;
  unaff_R13 = (char *)&local_338;
  pcVar5 = local_3d8;
  pcVar7 = (char *)0x0;
  do {
    pfStack_3f0 = (fdb_config *)0x1148fa;
    sprintf(pcVar10,"key%06d",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114914;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x11491c;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x11493b;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x11494a;
    fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pfVar9 = (fdb_config *)local_3d8._0_8_;
    pfVar8 = (fdb_config *)pcVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115018;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11496c;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00115008;
    pfStack_3f0 = (fdb_config *)0x11497c;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfStack_3f0 = (fdb_config *)0x114996;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x11499e;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x1149bd;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x1149cc;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar8 = (fdb_config *)local_3d8._0_8_;
    pcVar11 = (char *)pfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011502d;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x1149ee;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_0011501d;
    pfStack_3f0 = (fdb_config *)0x1149fe;
    fdb_doc_free((fdb_doc *)pfVar8);
    pfStack_3f0 = (fdb_config *)0x114a18;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114a20;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x114a3f;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114a4e;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pcVar11 = (char *)local_3d8._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115042;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114a70;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00115032;
    pfStack_3f0 = (fdb_config *)0x114a80;
    fdb_doc_free((fdb_doc *)pcVar11);
    uVar6 = (int)pcVar7 + 1;
    pcVar7 = (char *)(ulong)uVar6;
  } while (uVar6 != 100);
  pfStack_3f0 = (fdb_config *)0x114a9a;
  fVar1 = fdb_rollback((fdb_kvs_handle **)(local_3d8 + 8),local_3a8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115129;
  pcVar10 = (char *)&local_238;
  unaff_R13 = (char *)&local_338;
  pcVar5 = local_3d8;
  pcVar7 = (char *)0x0;
  do {
    pfStack_3f0 = (fdb_config *)0x114acc;
    sprintf(pcVar10,"key%06d",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114ae6;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114aee;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x114b0d;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114b1c;
    fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pfVar8 = (fdb_config *)local_3d8._0_8_;
    doc_00 = (fdb_config *)pcVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115057;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114b3e;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00115047;
    pfStack_3f0 = (fdb_config *)0x114b4e;
    fdb_doc_free((fdb_doc *)pfVar8);
    pfStack_3f0 = (fdb_config *)0x114b68;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114b70;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x114b8f;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114b9e;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    doc_00 = (fdb_config *)local_3d8._0_8_;
    pcVar11 = (char *)pfVar8;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011506c;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114bc0;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_0011505c;
    pfStack_3f0 = (fdb_config *)0x114bd0;
    fdb_doc_free((fdb_doc *)doc_00);
    pfStack_3f0 = (fdb_config *)0x114bea;
    sprintf(unaff_R13,"value%08d(%s)",pcVar7);
    pfStack_3f0 = (fdb_config *)0x114bf2;
    sVar4 = strlen(pcVar10);
    pfStack_3f0 = (fdb_config *)0x114c11;
    fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114c20;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pcVar11 = (char *)local_3d8._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115081;
    pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114c42;
    iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00115071;
    pfStack_3f0 = (fdb_config *)0x114c52;
    fdb_doc_free((fdb_doc *)pcVar11);
    uVar6 = (int)pcVar7 + 1;
    pcVar7 = (char *)(ulong)uVar6;
  } while (uVar6 != 100);
  pfStack_3f0 = (fdb_config *)0x114c67;
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)local_3d8._16_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011512e;
  pfStack_3f0 = (fdb_config *)0x114c79;
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)local_3d8._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115133;
  pfStack_3f0 = (fdb_config *)0x114c8b;
  fVar1 = fdb_close(local_3c0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115138;
  if ((local_3ac & 1) == 0) {
    pfStack_3f0 = (fdb_config *)0x114cb3;
    fVar1 = fdb_open(&local_3c0,"./multi_kv_test",&local_128);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_3f0 = (fdb_config *)0x114cbc;
      multi_kv_rollback_test();
      goto LAB_00114cbc;
    }
LAB_00114cf7:
    pfStack_3f0 = (fdb_config *)0x114d10;
    fdb_kvs_open(local_3c0,&local_3b8,(char *)0x0,&local_390);
    pfStack_3f0 = (fdb_config *)0x114d29;
    fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 0x10),"kv1",&local_390);
    pfStack_3f0 = (fdb_config *)0x114d42;
    fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 8),"kv2",&local_390);
    pcVar10 = (char *)&local_238;
    unaff_R13 = (char *)&local_338;
    pcVar5 = local_3d8;
    pcVar7 = (char *)0x0;
    while( true ) {
      pfStack_3f0 = (fdb_config *)0x114d6c;
      sprintf(pcVar10,"key%06d",pcVar7);
      pfStack_3f0 = (fdb_config *)0x114d86;
      sprintf(unaff_R13,"value%08d(%s)",pcVar7);
      pfStack_3f0 = (fdb_config *)0x114d8e;
      sVar4 = strlen(pcVar10);
      pfStack_3f0 = (fdb_config *)0x114dad;
      fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_3f0 = (fdb_config *)0x114dbc;
      fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
      doc_00 = (fdb_config *)local_3d8._0_8_;
      pfVar9 = (fdb_config *)pcVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
      pfStack_3f0 = (fdb_config *)0x114dde;
      iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00115086;
      pfStack_3f0 = (fdb_config *)0x114dee;
      fdb_doc_free((fdb_doc *)doc_00);
      pfStack_3f0 = (fdb_config *)0x114e08;
      sprintf(unaff_R13,"value%08d(%s)",pcVar7);
      pfStack_3f0 = (fdb_config *)0x114e10;
      sVar4 = strlen(pcVar10);
      pfStack_3f0 = (fdb_config *)0x114e2f;
      fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_3f0 = (fdb_config *)0x114e3e;
      fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      pfVar9 = (fdb_config *)local_3d8._0_8_;
      pcVar11 = (char *)doc_00;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150ab;
      pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
      pfStack_3f0 = (fdb_config *)0x114e60;
      iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011509b;
      pfStack_3f0 = (fdb_config *)0x114e70;
      fdb_doc_free((fdb_doc *)pfVar9);
      pfStack_3f0 = (fdb_config *)0x114e8a;
      sprintf(unaff_R13,"value%08d(%s)",pcVar7);
      pfStack_3f0 = (fdb_config *)0x114e92;
      sVar4 = strlen(pcVar10);
      pfStack_3f0 = (fdb_config *)0x114eb1;
      fdb_doc_create((fdb_doc **)pcVar5,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_3f0 = (fdb_config *)0x114ec0;
      fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      pcVar11 = (char *)local_3d8._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150c0;
      pfVar12 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
      pfStack_3f0 = (fdb_config *)0x114ee2;
      iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(local_3d8._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001150b0;
      pfStack_3f0 = (fdb_config *)0x114ef2;
      fdb_doc_free((fdb_doc *)pcVar11);
      uVar6 = (int)pcVar7 + 1;
      pcVar7 = (char *)(ulong)uVar6;
      if (uVar6 == 100) {
        pfStack_3f0 = (fdb_config *)0x114f07;
        fdb_kvs_close((fdb_kvs_handle *)local_3d8._16_8_);
        pfStack_3f0 = (fdb_config *)0x114f11;
        fdb_kvs_close((fdb_kvs_handle *)local_3d8._8_8_);
        pfStack_3f0 = (fdb_config *)0x114f1b;
        fdb_close(local_3c0);
        pfStack_3f0 = (fdb_config *)0x114f20;
        fdb_shutdown();
        pfStack_3f0 = (fdb_config *)0x114f25;
        memleak_end();
        if ((local_3ac & 1) == 0) {
          if ((multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass & 1) == 0) {
            pcVar10 = "%s PASSED\n";
          }
          else {
            pcVar10 = "%s FAILED\n";
          }
          pcVar5 = "multiple KV instances rollback test";
        }
        else {
          if ((multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass & 1) == 0) {
            pcVar10 = "%s PASSED\n";
          }
          else {
            pcVar10 = "%s FAILED\n";
          }
          pcVar5 = "multiple KV instances rollback test (custom key order)";
        }
        pfStack_3f0 = (fdb_config *)0x114f7b;
        fprintf(_stderr,pcVar10,pcVar5);
        return;
      }
    }
    goto LAB_00115096;
  }
LAB_00114cbc:
  pfStack_3f0 = (fdb_config *)0x114cef;
  fVar1 = fdb_open_custom_cmp(&local_3c0,"./multi_kv_test",&local_128,3,&local_358,&local_378,
                              (void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00114cf7;
  goto LAB_00115142;
LAB_001160d2:
  pcVar10 = (char *)&fStack_820;
  unaff_R13 = (char *)&fStack_930;
  pfVar9 = (fdb_config *)auStack_978;
  pfStack_988 = (fdb_config *)0x1160d7;
  multi_kv_custom_cmp_test();
LAB_001160d7:
  pfStack_988 = (fdb_config *)0x1160e4;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar8;
LAB_001160e4:
  pfStack_988 = (fdb_config *)0x1160e9;
  multi_kv_custom_cmp_test();
LAB_001160e9:
  pfStack_988 = (fdb_config *)0x1160f6;
  multi_kv_custom_cmp_test();
  pfVar8 = (fdb_config *)fconfig;
LAB_001160f6:
  pfStack_988 = (fdb_config *)0x1160fb;
  multi_kv_custom_cmp_test();
LAB_001160fb:
  pfStack_988 = (fdb_config *)0x116108;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar8;
LAB_00116108:
  pfStack_988 = (fdb_config *)0x11610d;
  multi_kv_custom_cmp_test();
LAB_0011610d:
  pfStack_988 = (fdb_config *)0x11611a;
  multi_kv_custom_cmp_test();
  pfVar8 = (fdb_config *)fconfig;
LAB_0011611a:
  fconfig = (code *)pfVar8;
  pfStack_988 = (fdb_config *)0x11611f;
  multi_kv_custom_cmp_test();
LAB_0011611f:
  pfStack_988 = (fdb_config *)0x116124;
  multi_kv_custom_cmp_test();
LAB_00116124:
  pfStack_988 = (fdb_config *)0x116131;
  multi_kv_custom_cmp_test();
  pcVar7 = (char *)pfVar9;
LAB_00116131:
  pfStack_988 = (fdb_config *)0x116136;
  multi_kv_custom_cmp_test();
LAB_00116136:
  pfStack_988 = (fdb_config *)0x116143;
  multi_kv_custom_cmp_test();
  pcVar5 = pcVar7;
LAB_00116143:
  pfStack_988 = (fdb_config *)0x116148;
  multi_kv_custom_cmp_test();
LAB_00116148:
  pfStack_988 = (fdb_config *)0x116155;
  multi_kv_custom_cmp_test();
  pcVar7 = pcVar5;
LAB_00116155:
  pfStack_988 = (fdb_config *)0x11615a;
  multi_kv_custom_cmp_test();
LAB_0011615a:
  pfStack_988 = (fdb_config *)0x11615f;
  multi_kv_custom_cmp_test();
LAB_0011615f:
  pfStack_988 = (fdb_config *)0x116164;
  multi_kv_custom_cmp_test();
LAB_00116164:
  pfStack_988 = (fdb_config *)0x116169;
  multi_kv_custom_cmp_test();
LAB_00116169:
  pfStack_988 = (fdb_config *)0x116176;
  multi_kv_custom_cmp_test();
  pfVar9 = (fdb_config *)pcVar7;
LAB_00116176:
  pfStack_988 = (fdb_config *)0x11617b;
  multi_kv_custom_cmp_test();
LAB_0011617b:
  pfStack_988 = (fdb_config *)0x116188;
  multi_kv_custom_cmp_test();
  pcVar5 = (char *)pfVar9;
LAB_00116188:
  pfStack_988 = (fdb_config *)0x11618d;
  multi_kv_custom_cmp_test();
LAB_0011618d:
  pfStack_988 = (fdb_config *)0x11619a;
  multi_kv_custom_cmp_test();
  pfVar9 = (fdb_config *)pcVar5;
LAB_0011619a:
  pfStack_988 = (fdb_config *)0x11619f;
  multi_kv_custom_cmp_test();
LAB_0011619f:
  pfStack_988 = (fdb_config *)0x1161ac;
  multi_kv_custom_cmp_test();
  pfVar8 = pfVar9;
LAB_001161ac:
  pfStack_988 = (fdb_config *)0x1161b1;
  multi_kv_custom_cmp_test();
LAB_001161b1:
  pfStack_988 = (fdb_config *)0x1161be;
  multi_kv_custom_cmp_test();
  pcVar5 = (char *)pfVar8;
LAB_001161be:
  pfStack_988 = (fdb_config *)0x1161c3;
  multi_kv_custom_cmp_test();
LAB_001161c3:
  pfStack_988 = (fdb_config *)0x1161d0;
  multi_kv_custom_cmp_test();
  pfVar8 = (fdb_config *)pcVar5;
LAB_001161d0:
  pcVar5 = (char *)pfVar8;
  pfStack_988 = (fdb_config *)0x1161d5;
  multi_kv_custom_cmp_test();
LAB_001161d5:
  pfStack_988 = (fdb_config *)0x1161da;
  multi_kv_custom_cmp_test();
LAB_001161da:
  pfStack_988 = (fdb_config *)0x1161ea;
  multi_kv_custom_cmp_test();
LAB_001161ea:
  pfStack_988 = (fdb_config *)0x1161f7;
  multi_kv_custom_cmp_test();
  goto LAB_001161f7;
LAB_001168fb:
  pfStack_d60 = (fdb_config *)0x116900;
  multi_kv_fdb_open_custom_cmp_test();
LAB_00116900:
  pfStack_d60 = (fdb_config *)0x116905;
  multi_kv_fdb_open_custom_cmp_test();
LAB_00116905:
  pfStack_d60 = (fdb_config *)0x116915;
  multi_kv_fdb_open_custom_cmp_test();
  doc_01 = (fdb_doc *)pcVar11;
LAB_00116915:
  pfStack_d60 = (fdb_config *)0x11691a;
  multi_kv_fdb_open_custom_cmp_test();
LAB_0011691a:
  pfStack_d60 = (fdb_config *)0x11692a;
  multi_kv_fdb_open_custom_cmp_test();
  pcVar10 = (char *)doc_01;
LAB_0011692a:
  pfStack_d60 = (fdb_config *)0x11692f;
  multi_kv_fdb_open_custom_cmp_test();
LAB_0011692f:
  pfStack_d60 = (fdb_config *)0x11693f;
  multi_kv_fdb_open_custom_cmp_test();
  doc_01 = (fdb_doc *)pcVar10;
LAB_0011693f:
  functions_00 = ap_Stack_ab8;
  unaff_R13 = (char *)&fStack_cb8;
  pcVar5 = auStack_d48;
  pfStack_d60 = (fdb_config *)0x116944;
  multi_kv_fdb_open_custom_cmp_test();
  goto LAB_00116944;
LAB_00116e7f:
  pfStackY_10e8 = (fdb_config *)0x116e8c;
  multi_kv_use_existing_mode_test();
  pfVar12 = pfVar8;
LAB_00116e8c:
  pfVar8 = pfVar12;
  pfStackY_10e8 = (fdb_config *)0x116e91;
  multi_kv_use_existing_mode_test();
LAB_00116e91:
  pfStackY_10e8 = (fdb_config *)0x116e96;
  multi_kv_use_existing_mode_test();
LAB_00116e96:
  pfStackY_10e8 = (fdb_config *)0x116ea3;
  multi_kv_use_existing_mode_test();
  pfVar12 = pfVar8;
LAB_00116ea3:
  functions_00 = ap_Stack_e90;
  pfStackY_10e8 = (fdb_config *)0x116ea8;
  multi_kv_use_existing_mode_test();
  goto LAB_00116ea8;
LAB_00114f9c:
  pfStack_3f0 = (fdb_config *)0x114fa1;
  multi_kv_rollback_test();
LAB_00114fa1:
  pfVar9 = pfVar8;
  pfStack_3f0 = (fdb_config *)0x114fa6;
  multi_kv_rollback_test();
LAB_00114fa6:
  pfStack_3f0 = (fdb_config *)0x114fab;
  multi_kv_rollback_test();
LAB_00114fab:
  pfStack_3f0 = (fdb_config *)0x114fb0;
  multi_kv_rollback_test();
LAB_00114fb0:
  pfVar8 = pfVar9;
  pfStack_3f0 = (fdb_config *)0x114fb5;
  multi_kv_rollback_test();
LAB_00114fb5:
  pfStack_3f0 = (fdb_config *)0x114fba;
  multi_kv_rollback_test();
LAB_00114fba:
  pfStack_3f0 = (fdb_config *)0x114fbf;
  multi_kv_rollback_test();
LAB_00114fbf:
  unaff_R12 = pfVar8;
  pfStack_3f0 = (fdb_config *)0x114fc4;
  multi_kv_rollback_test();
LAB_00114fc4:
  pcVar5 = (char *)&local_338;
  pcVar7 = "value%08d(%s)";
  pfStack_3f0 = (fdb_config *)0x114fc9;
  multi_kv_rollback_test();
LAB_00114fc9:
  pfStack_3f0 = (fdb_config *)0x114fd9;
  multi_kv_rollback_test();
  pfVar9 = unaff_R12;
LAB_00114fd9:
  pfStack_3f0 = (fdb_config *)0x114fde;
  multi_kv_rollback_test();
LAB_00114fde:
  pfStack_3f0 = (fdb_config *)0x114fee;
  multi_kv_rollback_test();
  pcVar11 = (char *)pfVar9;
LAB_00114fee:
  pfStack_3f0 = (fdb_config *)0x114ff3;
  multi_kv_rollback_test();
LAB_00114ff3:
  pfStack_3f0 = (fdb_config *)0x115003;
  multi_kv_rollback_test();
  pfVar9 = (fdb_config *)pcVar11;
LAB_00115003:
  pfStack_3f0 = (fdb_config *)0x115008;
  multi_kv_rollback_test();
LAB_00115008:
  pfStack_3f0 = (fdb_config *)0x115018;
  multi_kv_rollback_test();
  pfVar8 = pfVar9;
LAB_00115018:
  pfStack_3f0 = (fdb_config *)0x11501d;
  multi_kv_rollback_test();
LAB_0011501d:
  pfStack_3f0 = (fdb_config *)0x11502d;
  multi_kv_rollback_test();
  pcVar11 = (char *)pfVar8;
LAB_0011502d:
  pfStack_3f0 = (fdb_config *)0x115032;
  multi_kv_rollback_test();
LAB_00115032:
  pfStack_3f0 = (fdb_config *)0x115042;
  multi_kv_rollback_test();
  pfVar8 = (fdb_config *)pcVar11;
LAB_00115042:
  pfStack_3f0 = (fdb_config *)0x115047;
  multi_kv_rollback_test();
LAB_00115047:
  pfStack_3f0 = (fdb_config *)0x115057;
  multi_kv_rollback_test();
  doc_00 = pfVar8;
LAB_00115057:
  pfStack_3f0 = (fdb_config *)0x11505c;
  multi_kv_rollback_test();
LAB_0011505c:
  pfStack_3f0 = (fdb_config *)0x11506c;
  multi_kv_rollback_test();
  pcVar11 = (char *)doc_00;
LAB_0011506c:
  pfStack_3f0 = (fdb_config *)0x115071;
  multi_kv_rollback_test();
LAB_00115071:
  pfStack_3f0 = (fdb_config *)0x115081;
  multi_kv_rollback_test();
  doc_00 = (fdb_config *)pcVar11;
LAB_00115081:
  pfStack_3f0 = (fdb_config *)0x115086;
  multi_kv_rollback_test();
LAB_00115086:
  pfStack_3f0 = (fdb_config *)0x115096;
  multi_kv_rollback_test();
  pfVar9 = doc_00;
LAB_00115096:
  pfStack_3f0 = (fdb_config *)0x11509b;
  multi_kv_rollback_test();
LAB_0011509b:
  pfStack_3f0 = (fdb_config *)0x1150ab;
  multi_kv_rollback_test();
  pcVar11 = (char *)pfVar9;
LAB_001150ab:
  pfStack_3f0 = (fdb_config *)0x1150b0;
  multi_kv_rollback_test();
LAB_001150b0:
  pfStack_3f0 = (fdb_config *)0x1150c0;
  multi_kv_rollback_test();
  pfVar9 = (fdb_config *)pcVar11;
LAB_001150c0:
  pfStack_3f0 = (fdb_config *)0x1150c5;
  multi_kv_rollback_test();
LAB_001150c5:
  pfStack_3f0 = (fdb_config *)0x1150ca;
  multi_kv_rollback_test();
LAB_001150ca:
  pfStack_3f0 = (fdb_config *)0x1150cf;
  multi_kv_rollback_test();
LAB_001150cf:
  pfStack_3f0 = (fdb_config *)0x1150d4;
  multi_kv_rollback_test();
  pfVar8 = pfVar9;
LAB_001150d4:
  pfStack_3f0 = (fdb_config *)0x1150d9;
  multi_kv_rollback_test();
LAB_001150d9:
  pfStack_3f0 = (fdb_config *)0x1150de;
  multi_kv_rollback_test();
  unaff_R12 = pfVar8;
LAB_001150de:
  pfStack_3f0 = (fdb_config *)0x1150e3;
  multi_kv_rollback_test();
LAB_001150e3:
  pfStack_3f0 = (fdb_config *)0x1150e8;
  multi_kv_rollback_test();
LAB_001150e8:
  pfStack_3f0 = (fdb_config *)0x1150ed;
  multi_kv_rollback_test();
  chunksize = (size_t)pcVar7;
LAB_001150ed:
  pfStack_3f0 = (fdb_config *)0x1150f2;
  multi_kv_rollback_test();
LAB_001150f2:
  pfStack_3f0 = (fdb_config *)0x1150f7;
  multi_kv_rollback_test();
  pcVar7 = (char *)chunksize;
  pcVar11 = (char *)unaff_R12;
  pfVar9 = (fdb_config *)pcVar10;
LAB_001150f7:
  pfStack_3f0 = (fdb_config *)0x1150fc;
  multi_kv_rollback_test();
LAB_001150fc:
  pfStack_3f0 = (fdb_config *)0x115101;
  multi_kv_rollback_test();
LAB_00115101:
  pfStack_3f0 = (fdb_config *)0x115106;
  multi_kv_rollback_test();
LAB_00115106:
  pfStack_3f0 = (fdb_config *)0x11510b;
  multi_kv_rollback_test();
  pfVar8 = pfVar9;
LAB_0011510b:
  pfStack_3f0 = (fdb_config *)0x115110;
  multi_kv_rollback_test();
LAB_00115110:
  pfStack_3f0 = (fdb_config *)0x115115;
  multi_kv_rollback_test();
  unaff_R12 = pfVar8;
LAB_00115115:
  pfStack_3f0 = (fdb_config *)0x11511a;
  multi_kv_rollback_test();
LAB_0011511a:
  pfStack_3f0 = (fdb_config *)0x11511f;
  multi_kv_rollback_test();
  pcVar10 = (char *)unaff_R12;
LAB_0011511f:
  pfStack_3f0 = (fdb_config *)0x115124;
  multi_kv_rollback_test();
LAB_00115124:
  pfStack_3f0 = (fdb_config *)0x115129;
  multi_kv_rollback_test();
LAB_00115129:
  pfStack_3f0 = (fdb_config *)0x11512e;
  multi_kv_rollback_test();
LAB_0011512e:
  pfStack_3f0 = (fdb_config *)0x115133;
  multi_kv_rollback_test();
LAB_00115133:
  pfStack_3f0 = (fdb_config *)0x115138;
  multi_kv_rollback_test();
LAB_00115138:
  pfStack_3f0 = (fdb_config *)0x11513d;
  multi_kv_rollback_test();
LAB_0011513d:
  pfStack_3f0 = (fdb_config *)0x115142;
  multi_kv_rollback_test();
LAB_00115142:
  pfStack_3f0 = (fdb_config *)multi_kv_custom_cmp_test;
  multi_kv_rollback_test();
  pfStack_988 = (fdb_config *)0x115167;
  pcStack_418 = pcVar7;
  pfStack_410 = (fdb_config *)pcVar11;
  pfStack_408 = (fdb_config *)unaff_R13;
  pfStack_400 = (fdb_config *)pcVar10;
  pfStack_3f8 = pfVar12;
  pfStack_3f0 = (fdb_config *)pcVar5;
  gettimeofday(&tStack_830,(__timezone_ptr_t)0x0);
  fStack_930._0_8_ = 0x202066722d206d72;
  fStack_930.buffercache_size._0_2_ = 0x756d;
  fStack_930.buffercache_size._2_2_ = 0x746c;
  fStack_930.buffercache_size._4_3_ = 0x6b5f69;
  fStack_930.buffercache_size._7_1_ = 0x76;
  fStack_930.wal_threshold._0_7_ = 0x2a747365745f;
  pfStack_988 = (fdb_config *)0x115189;
  system((char *)&fStack_930);
  pfStack_988 = (fdb_config *)0x11518e;
  memleak_start();
  fconfig = (code *)&fStack_718;
  pfStack_988 = (fdb_config *)0x11519e;
  fdb_get_default_config();
  pfStack_988 = (fdb_config *)0x1151a8;
  fdb_get_default_kvs_config();
  fStack_718.seqtree_opt = '\x01';
  fStack_718.multi_kv_instances = true;
  fStack_718.wal_threshold = 0x100;
  fStack_718.wal_flush_before_commit = false;
  fStack_718.buffercache_size = 0;
  pfStack_988 = (fdb_config *)0x1151d8;
  fVar1 = fdb_open((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",(fdb_config *)fconfig);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_988 = (fdb_config *)0x1151f6;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,&pfStack_960,(char *)0x0,&fStack_948);
    pfVar8 = (fdb_config *)fconfig;
    pfVar9 = (fdb_config *)pcVar5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161fc;
    pcVar10 = (char *)&fStack_820;
    pcVar11 = "default";
    unaff_R13 = (char *)&fStack_930;
    pfVar9 = (fdb_config *)auStack_978;
    pfVar8 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x11522c;
      sprintf(pcVar10,"key%06d",pfVar8);
      pfStack_988 = (fdb_config *)0x115242;
      sprintf(unaff_R13,"value%08d(%s)",pfVar8);
      pfStack_988 = (fdb_config *)0x11524a;
      sVar4 = strlen(pcVar10);
      pfVar12 = (fdb_config *)(sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115256;
      sVar4 = strlen(unaff_R13);
      pfStack_988 = (fdb_config *)0x115273;
      fdb_doc_create((fdb_doc **)pfVar9,pcVar10,(size_t)pfVar12,(void *)0x0,0,unaff_R13,sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115282;
      fVar1 = fdb_set(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_988 = (fdb_config *)0x1160d2;
        multi_kv_custom_cmp_test();
        goto LAB_001160d2;
      }
      pfStack_988 = (fdb_config *)0x115294;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar6 = (int)pfVar8 + 1;
      pfVar8 = (fdb_config *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x1152ae;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116201;
    fStack_948.custom_cmp = _multi_kv_test_keycmp;
    pfStack_988 = (fdb_config *)0x1152dc;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,
                         (fdb_kvs_handle **)(auStack_978 + 0x10),"kv1",&fStack_948);
    fconfig = (code *)pfVar8;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116206;
    pcVar10 = (char *)&fStack_820;
    pcVar11 = "kv1_custom_cmp";
    unaff_R13 = (char *)&fStack_930;
    pfVar9 = (fdb_config *)auStack_978;
    fconfig = (code *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115312;
      sprintf(pcVar10,"key%06d",fconfig);
      pfStack_988 = (fdb_config *)0x115328;
      sprintf(unaff_R13,"value%08d(%s)",fconfig);
      pfStack_988 = (fdb_config *)0x115330;
      sVar4 = strlen(pcVar10);
      pfVar12 = (fdb_config *)(sVar4 + 1);
      pfStack_988 = (fdb_config *)0x11533c;
      sVar4 = strlen(unaff_R13);
      pfStack_988 = (fdb_config *)0x115359;
      fdb_doc_create((fdb_doc **)pfVar9,pcVar10,(size_t)pfVar12,(void *)0x0,0,unaff_R13,sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115368;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pfVar8 = (fdb_config *)fconfig;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160d2;
      pfStack_988 = (fdb_config *)0x11537a;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar6 = (int)fconfig + 1;
      fconfig = (code *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x115394;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011620b;
    pfVar12 = &fStack_820;
    pfVar9 = &fStack_930;
    pcVar10 = auStack_978;
    unaff_R13 = (char *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x1153c5;
      sprintf((char *)pfVar12,"key%06d",unaff_R13);
      pfStack_988 = (fdb_config *)0x1153e0;
      sprintf((char *)pfVar9,"value%08d(%s)",unaff_R13);
      pfStack_988 = (fdb_config *)0x1153e8;
      sVar4 = strlen((char *)pfVar12);
      pfStack_988 = (fdb_config *)0x115407;
      fdb_doc_create((fdb_doc **)pcVar10,pfVar12,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115416;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar8 = (fdb_config *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160e4;
      pcVar11 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115436;
      iVar3 = bcmp(pfVar9,pcVar11,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001160d7;
      pfStack_988 = (fdb_config *)0x115446;
      fdb_doc_free((fdb_doc *)pfVar8);
      pfStack_988 = (fdb_config *)0x115461;
      sprintf((char *)pfVar9,"value%08d(%s)",unaff_R13);
      pfStack_988 = (fdb_config *)0x115469;
      sVar4 = strlen((char *)pfVar12);
      pfStack_988 = (fdb_config *)0x115488;
      fdb_doc_create((fdb_doc **)pcVar10,pfVar12,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115497;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      fconfig = (code *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160f6;
      pcVar11 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x1154b7;
      iVar3 = bcmp(pfVar9,pcVar11,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001160e9;
      pfStack_988 = (fdb_config *)0x1154c7;
      fdb_doc_free((fdb_doc *)fconfig);
      uVar6 = (int)unaff_R13 + 1;
      unaff_R13 = (char *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x1154e1;
    fVar1 = fdb_close((fdb_file_handle *)auStack_978._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116210;
    fStack_948.custom_cmp = (fdb_custom_cmp_variable)0x0;
    pfStack_988 = (fdb_config *)0x11550b;
    fVar1 = fdb_open((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",&fStack_718);
    fconfig = _multi_kv_test_keycmp;
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116215;
    afStack_520[0].keylen = 0;
    afStack_620[0].keylen = (size_t)_multi_kv_test_keycmp;
    pfStack_988 = (fdb_config *)0x115554;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",&fStack_718,
                                1,(char **)afStack_520,(fdb_custom_cmp_variable *)afStack_620,
                                (void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011621a;
    afStack_520[0].keylen = 0x150035;
    afStack_620[0].keylen = (size_t)_multi_kv_test_keycmp;
    pfStack_988 = (fdb_config *)0x11559f;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",&fStack_718,
                                1,(char **)afStack_520,(fdb_custom_cmp_variable *)afStack_620,
                                (void **)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011621f;
    pfStack_988 = (fdb_config *)0x1155bd;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,&pfStack_960,(char *)0x0,&fStack_948);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116224;
    pfStack_988 = (fdb_config *)0x1155e0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,
                         (fdb_kvs_handle **)(auStack_978 + 0x10),"kv1",&fStack_948);
    pcVar5 = (char *)pfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116229;
    pcVar10 = (char *)&fStack_820;
    unaff_R13 = (char *)&fStack_930;
    pfVar9 = (fdb_config *)auStack_978;
    pcVar11 = (char *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115611;
      sprintf(pcVar10,"key%06d",pcVar11);
      pfStack_988 = (fdb_config *)0x11562c;
      sprintf(unaff_R13,"value%08d(%s)",pcVar11);
      pfStack_988 = (fdb_config *)0x115634;
      sVar4 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115653;
      fdb_doc_create((fdb_doc **)pfVar9,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115662;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar8 = (fdb_config *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116108;
      pfVar12 = *(fdb_config **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115682;
      iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001160fb;
      pfStack_988 = (fdb_config *)0x115692;
      fdb_doc_free((fdb_doc *)pfVar8);
      pfStack_988 = (fdb_config *)0x1156ad;
      sprintf(unaff_R13,"value%08d(%s)",pcVar11);
      pfStack_988 = (fdb_config *)0x1156b5;
      sVar4 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x1156d4;
      fdb_doc_create((fdb_doc **)pfVar9,pcVar10,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x1156e3;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      fconfig = (code *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011611a;
      pfVar12 = *(fdb_config **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115703;
      iVar3 = bcmp(unaff_R13,pfVar12,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011610d;
      pfStack_988 = (fdb_config *)0x115713;
      fdb_doc_free((fdb_doc *)fconfig);
      uVar6 = (int)pcVar11 + 1;
      pcVar11 = (char *)(ulong)uVar6;
    } while (uVar6 != 1000);
    fStack_948.custom_cmp = (fdb_custom_cmp_variable)0x0;
    pfStack_988 = (fdb_config *)0x115746;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,&pfStack_958,"kv2",&fStack_948);
    pcVar5 = (char *)pfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011622e;
    pcVar10 = (char *)&fStack_820;
    pcVar11 = "kv2";
    unaff_R13 = (char *)&fStack_930;
    pcVar5 = auStack_978;
    fconfig = (code *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x11577c;
      sprintf(pcVar10,"key%06d",fconfig);
      pfStack_988 = (fdb_config *)0x115792;
      sprintf(unaff_R13,"value%08d(%s)",fconfig);
      pfStack_988 = (fdb_config *)0x11579a;
      sVar4 = strlen(pcVar10);
      pfVar12 = (fdb_config *)(sVar4 + 1);
      pfStack_988 = (fdb_config *)0x1157a6;
      sVar4 = strlen(unaff_R13);
      pfStack_988 = (fdb_config *)0x1157c3;
      fdb_doc_create((fdb_doc **)pcVar5,pcVar10,(size_t)pfVar12,(void *)0x0,0,unaff_R13,sVar4 + 1);
      pfStack_988 = (fdb_config *)0x1157d2;
      fVar1 = fdb_set(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pfVar9 = (fdb_config *)pcVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011611f;
      pfStack_988 = (fdb_config *)0x1157e4;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar6 = (int)fconfig + 1;
      fconfig = (code *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x1157fe;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116233;
    pcVar11 = (char *)&fStack_820;
    fconfig = (code *)&fStack_930;
    pcVar10 = auStack_978;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x11582f;
      sprintf(pcVar11,"key%06d",pfVar12);
      pfStack_988 = (fdb_config *)0x11584a;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115852;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115871;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115880;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar9 = (fdb_config *)auStack_978._0_8_;
      pcVar7 = pcVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116131;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x1158a0;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00116124;
      pfStack_988 = (fdb_config *)0x1158b0;
      fdb_doc_free((fdb_doc *)pfVar9);
      pfStack_988 = (fdb_config *)0x1158cb;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x1158d3;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x1158f2;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115901;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pcVar7 = (char *)auStack_978._0_8_;
      pcVar5 = (char *)pfVar9;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116143;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115921;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00116136;
      pfStack_988 = (fdb_config *)0x115931;
      fdb_doc_free((fdb_doc *)pcVar7);
      pfStack_988 = (fdb_config *)0x11594c;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115954;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115973;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115982;
      fVar1 = fdb_get(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar5 = (char *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116155;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x1159a2;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00116148;
      pfStack_988 = (fdb_config *)0x1159b2;
      fdb_doc_free((fdb_doc *)pcVar5);
      uVar6 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar6;
    } while (uVar6 != 1000);
    unaff_R13 = (char *)&fStack_820;
    pfVar12 = &fStack_930;
    pcVar11 = (char *)0x0;
    do {
      pcVar10 = auStack_978;
      pfStack_988 = (fdb_config *)0x1159ee;
      sprintf(unaff_R13,"key%06d",pcVar11);
      pcVar7 = "value%08d(%s)";
      pfStack_988 = (fdb_config *)0x115a0c;
      sprintf((char *)pfVar12,"value%08d(%s)",pcVar11);
      pfStack_988 = (fdb_config *)0x115a14;
      sVar4 = strlen(unaff_R13);
      fconfig = (code *)(sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115a20;
      sVar4 = strlen((char *)pfVar12);
      pfStack_988 = (fdb_config *)0x115a3d;
      fdb_doc_create((fdb_doc **)pcVar10,unaff_R13,(size_t)fconfig,(void *)0x0,0,pfVar12,sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115a4c;
      fVar1 = fdb_set(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011615a;
      pfStack_988 = (fdb_config *)0x115a5e;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      pcVar10 = "key%06d";
      pfStack_988 = (fdb_config *)0x115a75;
      sprintf(unaff_R13,"key%06d",pcVar11);
      pfStack_988 = (fdb_config *)0x115a8c;
      sprintf((char *)pfVar12,"value%08d(%s)",pcVar11);
      pfStack_988 = (fdb_config *)0x115a94;
      sVar4 = strlen(unaff_R13);
      fconfig = (code *)(sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115aa0;
      sVar4 = strlen((char *)pfVar12);
      pfStack_988 = (fdb_config *)0x115abf;
      fdb_doc_create((fdb_doc **)auStack_978,unaff_R13,(size_t)fconfig,(void *)0x0,0,pfVar12,
                     sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115ace;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011615f;
      pfStack_988 = (fdb_config *)0x115ae0;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      pcVar5 = "key%06d";
      pfStack_988 = (fdb_config *)0x115af6;
      sprintf(unaff_R13,"key%06d",pcVar11);
      pfStack_988 = (fdb_config *)0x115b0d;
      sprintf((char *)pfVar12,"value%08d(%s)",pcVar11);
      pfStack_988 = (fdb_config *)0x115b15;
      sVar4 = strlen(unaff_R13);
      fconfig = (code *)(sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115b21;
      sVar4 = strlen((char *)pfVar12);
      pcVar10 = auStack_978;
      pfStack_988 = (fdb_config *)0x115b43;
      fdb_doc_create((fdb_doc **)pcVar10,unaff_R13,(size_t)fconfig,(void *)0x0,0,pfVar12,sVar4 + 1);
      pfStack_988 = (fdb_config *)0x115b52;
      fVar1 = fdb_set(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar7 = pcVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116164;
      pfStack_988 = (fdb_config *)0x115b64;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar6 = (int)pcVar11 + 1;
      pcVar11 = (char *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x115b80;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116238;
    pcVar11 = (char *)&fStack_820;
    fconfig = (code *)&fStack_930;
    pcVar10 = auStack_978;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115bb1;
      sprintf(pcVar11,"key%06d",pfVar12);
      pfStack_988 = (fdb_config *)0x115bcc;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115bd4;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115bf3;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115c02;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pcVar7 = (char *)auStack_978._0_8_;
      pfVar9 = (fdb_config *)pcVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116176;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115c22;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00116169;
      pfStack_988 = (fdb_config *)0x115c32;
      fdb_doc_free((fdb_doc *)pcVar7);
      pfStack_988 = (fdb_config *)0x115c4d;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115c55;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115c74;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115c83;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pfVar9 = (fdb_config *)auStack_978._0_8_;
      pcVar5 = pcVar7;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116188;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115ca3;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011617b;
      pfStack_988 = (fdb_config *)0x115cb3;
      fdb_doc_free((fdb_doc *)pfVar9);
      pfStack_988 = (fdb_config *)0x115cce;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115cd6;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115cf5;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115d04;
      fVar1 = fdb_get(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar5 = (char *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011619a;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115d24;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011618d;
      pfStack_988 = (fdb_config *)0x115d34;
      fdb_doc_free((fdb_doc *)pcVar5);
      uVar6 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x115d55;
    fVar1 = fdb_compact((fdb_file_handle *)auStack_978._8_8_,"./multi_kv_test2");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011623d;
    pcVar11 = (char *)&fStack_820;
    fconfig = (code *)&fStack_930;
    pcVar10 = auStack_978;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115d86;
      sprintf(pcVar11,"key%06d",pfVar12);
      pfStack_988 = (fdb_config *)0x115da1;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115da9;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115dc8;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115dd7;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar9 = (fdb_config *)auStack_978._0_8_;
      pfVar8 = (fdb_config *)pcVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161ac;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115df7;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011619f;
      pfStack_988 = (fdb_config *)0x115e07;
      fdb_doc_free((fdb_doc *)pfVar9);
      pfStack_988 = (fdb_config *)0x115e22;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115e2a;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115e49;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115e58;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pfVar8 = (fdb_config *)auStack_978._0_8_;
      pcVar5 = (char *)pfVar9;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161be;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115e78;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001161b1;
      pfStack_988 = (fdb_config *)0x115e88;
      fdb_doc_free((fdb_doc *)pfVar8);
      pfStack_988 = (fdb_config *)0x115ea3;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar12);
      pfStack_988 = (fdb_config *)0x115eab;
      sVar4 = strlen(pcVar11);
      pfStack_988 = (fdb_config *)0x115eca;
      fdb_doc_create((fdb_doc **)pcVar10,pcVar11,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115ed9;
      fVar1 = fdb_get(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar5 = (char *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161d0;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115ef9;
      iVar3 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001161c3;
      pfStack_988 = (fdb_config *)0x115f09;
      fdb_doc_free((fdb_doc *)pcVar5);
      uVar6 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_988 = (fdb_config *)0x115f37;
    fVar1 = fdb_doc_create((fdb_doc **)auStack_978,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116242;
    *(fdb_doc **)(auStack_978._0_8_ + 0x20) = afStack_520;
    *(fdb_doc **)(auStack_978._0_8_ + 0x40) = afStack_620;
    pfStack_988 = (fdb_config *)0x115f7c;
    fVar1 = fdb_iterator_init((fdb_kvs_handle *)auStack_978._16_8_,&pfStack_950,(void *)0x0,0,
                              (void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116247;
    pfVar12 = &fStack_820;
    unaff_R13 = "kv1_custom_cmp(updated)";
    fconfig = (code *)&fStack_930;
    pcVar5 = (char *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115fa9;
      fVar1 = fdb_iterator_get(pfStack_950,(fdb_doc **)auStack_978);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161d5;
      pfStack_988 = (fdb_config *)0x115fc4;
      sprintf((char *)pfVar12,"key%06d",pcVar5);
      pfStack_988 = (fdb_config *)0x115fda;
      sprintf((char *)fconfig,"value%08d(%s)",pcVar5,"kv1_custom_cmp(updated)");
      pcVar11 = (char *)auStack_978._0_8_;
      pcVar10 = *(char **)(auStack_978._0_8_ + 0x20);
      pfStack_988 = (fdb_config *)0x115ff3;
      iVar3 = bcmp(pcVar10,pfVar12,(size_t)*(fdb_doc **)auStack_978._0_8_);
      if (iVar3 != 0) goto LAB_001161da;
      pcVar10 = *(char **)((long)pcVar11 + 0x40);
      pfStack_988 = (fdb_config *)0x116010;
      iVar3 = bcmp(pcVar10,fconfig,*(uint64_t *)((long)pcVar11 + 0x10));
      if (iVar3 != 0) goto LAB_001161ea;
      uVar6 = (int)pcVar5 + 1;
      pcVar5 = (char *)(ulong)uVar6;
      pfStack_988 = (fdb_config *)0x116024;
      fVar1 = fdb_iterator_next(pfStack_950);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    if (uVar6 != 1000) goto LAB_0011624c;
    pfStack_988 = (fdb_config *)0x116042;
    fVar1 = fdb_iterator_close(pfStack_950);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116251;
    pfStack_988 = (fdb_config *)0x116054;
    fVar1 = fdb_close((fdb_file_handle *)auStack_978._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116256;
    pfStack_988 = (fdb_config *)0x116061;
    fVar1 = fdb_shutdown();
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011625b;
    *(undefined8 *)(auStack_978._0_8_ + 0x20) = 0;
    *(undefined8 *)(auStack_978._0_8_ + 0x40) = 0;
    pfStack_988 = (fdb_config *)0x11607d;
    fVar1 = fdb_doc_free((fdb_doc *)auStack_978._0_8_);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_988 = (fdb_config *)0x11608a;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (multi_kv_custom_cmp_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_988 = (fdb_config *)0x1160bb;
      fprintf(_stderr,pcVar10,"multiple KV instances custom comparison function test");
      return;
    }
  }
  else {
LAB_001161f7:
    pfStack_988 = (fdb_config *)0x1161fc;
    multi_kv_custom_cmp_test();
    pfVar8 = (fdb_config *)fconfig;
    pfVar9 = (fdb_config *)pcVar5;
LAB_001161fc:
    pfStack_988 = (fdb_config *)0x116201;
    multi_kv_custom_cmp_test();
LAB_00116201:
    pfStack_988 = (fdb_config *)0x116206;
    multi_kv_custom_cmp_test();
    fconfig = (code *)pfVar8;
LAB_00116206:
    pfStack_988 = (fdb_config *)0x11620b;
    multi_kv_custom_cmp_test();
LAB_0011620b:
    pfStack_988 = (fdb_config *)0x116210;
    multi_kv_custom_cmp_test();
LAB_00116210:
    pfStack_988 = (fdb_config *)0x116215;
    multi_kv_custom_cmp_test();
LAB_00116215:
    pfStack_988 = (fdb_config *)0x11621a;
    multi_kv_custom_cmp_test();
LAB_0011621a:
    pfStack_988 = (fdb_config *)0x11621f;
    multi_kv_custom_cmp_test();
LAB_0011621f:
    pfStack_988 = (fdb_config *)0x116224;
    multi_kv_custom_cmp_test();
LAB_00116224:
    pfStack_988 = (fdb_config *)0x116229;
    multi_kv_custom_cmp_test();
    pcVar5 = (char *)pfVar9;
LAB_00116229:
    pfStack_988 = (fdb_config *)0x11622e;
    multi_kv_custom_cmp_test();
LAB_0011622e:
    pfStack_988 = (fdb_config *)0x116233;
    multi_kv_custom_cmp_test();
LAB_00116233:
    pfStack_988 = (fdb_config *)0x116238;
    multi_kv_custom_cmp_test();
LAB_00116238:
    pfStack_988 = (fdb_config *)0x11623d;
    multi_kv_custom_cmp_test();
LAB_0011623d:
    pfStack_988 = (fdb_config *)0x116242;
    multi_kv_custom_cmp_test();
LAB_00116242:
    pfStack_988 = (fdb_config *)0x116247;
    multi_kv_custom_cmp_test();
LAB_00116247:
    pfStack_988 = (fdb_config *)0x11624c;
    multi_kv_custom_cmp_test();
LAB_0011624c:
    pfStack_988 = (fdb_config *)0x116251;
    multi_kv_custom_cmp_test();
LAB_00116251:
    pfStack_988 = (fdb_config *)0x116256;
    multi_kv_custom_cmp_test();
LAB_00116256:
    pfStack_988 = (fdb_config *)0x11625b;
    multi_kv_custom_cmp_test();
LAB_0011625b:
    pfStack_988 = (fdb_config *)0x116260;
    multi_kv_custom_cmp_test();
  }
  pfStack_988 = (fdb_config *)multi_kv_fdb_open_custom_cmp_test;
  multi_kv_custom_cmp_test();
  doc_01 = (fdb_doc *)0x0;
  pfStack_d60 = (fdb_config *)0x116288;
  pfStack_9b0 = (fdb_config *)fconfig;
  pfStack_9a8 = (fdb_config *)pcVar11;
  pfStack_9a0 = (fdb_config *)unaff_R13;
  pfStack_998 = (fdb_config *)pcVar10;
  pfStack_990 = pfVar12;
  pfStack_988 = (fdb_config *)pcVar5;
  gettimeofday(&tStack_cc8,(__timezone_ptr_t)0x0);
  kvs_names_00 = &pcStack_ce8;
  pcStack_cd8 = "kv2";
  pcStack_ce8 = "default";
  pcStack_ce0 = "kv1";
  functions_00 = &p_Stack_d08;
  pcStack_cf8 = (code *)0x0;
  p_Stack_d08 = _multi_kv_test_keycmp;
  pcStack_d00 = _multi_kv_test_keycmp;
  fStack_cb8.wal_threshold._0_1_ = '_';
  fStack_cb8.wal_threshold._1_1_ = 't';
  fStack_cb8.wal_threshold._2_1_ = 'e';
  fStack_cb8.wal_threshold._3_1_ = 's';
  fStack_cb8.wal_threshold._4_1_ = 't';
  fStack_cb8.wal_threshold._5_1_ = '*';
  fStack_cb8.wal_threshold._6_1_ = '\0';
  fStack_cb8._0_8_ = 0x202066722d206d72;
  fStack_cb8.buffercache_size._0_1_ = 'm';
  fStack_cb8.buffercache_size._1_1_ = 'u';
  fStack_cb8.buffercache_size._2_1_ = 'l';
  fStack_cb8.buffercache_size._3_1_ = 't';
  fStack_cb8.buffercache_size._4_1_ = 'i';
  fStack_cb8.buffercache_size._5_1_ = '_';
  fStack_cb8.buffercache_size._6_1_ = 'k';
  fStack_cb8.buffercache_size._7_1_ = 'v';
  pfStack_d60 = (fdb_config *)0x1162e2;
  system((char *)&fStack_cb8);
  pfStack_d60 = (fdb_config *)0x1162e7;
  memleak_start();
  pfVar12 = &fStack_bb0;
  pfStack_d60 = (fdb_config *)0x1162f7;
  fdb_get_default_config();
  pfStack_d60 = (fdb_config *)0x116301;
  fdb_get_default_kvs_config();
  fStack_bb0.seqtree_opt = '\x01';
  fStack_bb0.multi_kv_instances = true;
  fStack_bb0.wal_threshold = 0x100;
  fStack_bb0.wal_flush_before_commit = false;
  fStack_bb0.buffercache_size = 0;
  pfStack_d60 = (fdb_config *)0x11633f;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",pfVar12,3,
                              kvs_names_00,functions_00,(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_d60 = (fdb_config *)0x11635d;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d28,(char *)0x0,&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116949;
    pfStack_d60 = (fdb_config *)0x116380;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d30,"kv1",&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011694e;
    fStack_d20.custom_cmp = _multi_kv_test_keycmp;
    pfStack_d60 = (fdb_config *)0x1163ae;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,
                         (fdb_kvs_handle **)(auStack_d48 + 0x10),"kv2",&fStack_d20);
    pcVar10 = (char *)doc_01;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116953;
    pcVar11 = "default";
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x1163e7;
      sprintf((char *)ap_Stack_ab8,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x1163fd;
      sprintf((char *)&fStack_cb8,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116405;
      sVar4 = strlen((char *)ap_Stack_ab8);
      pfVar12 = (fdb_config *)(sVar4 + 1);
      pfStack_d60 = (fdb_config *)0x116411;
      sVar4 = strlen((char *)&fStack_cb8);
      pfStack_d60 = (fdb_config *)0x11642e;
      fdb_doc_create((fdb_doc **)auStack_d48,ap_Stack_ab8,(size_t)pfVar12,(void *)0x0,0,&fStack_cb8,
                     sVar4 + 1);
      pfStack_d60 = (fdb_config *)0x11643d;
      fVar1 = fdb_set(pfStack_d28,(fdb_doc *)auStack_d48._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_d60 = (fdb_config *)0x1168fb;
        multi_kv_fdb_open_custom_cmp_test();
        goto LAB_001168fb;
      }
      pfStack_d60 = (fdb_config *)0x11644f;
      fdb_doc_free((fdb_doc *)auStack_d48._0_8_);
      uVar6 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar6;
    } while (uVar6 != 1000);
    pcVar11 = "kv1_custom_cmp";
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x11648e;
      sprintf((char *)ap_Stack_ab8,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x1164a4;
      sprintf((char *)&fStack_cb8,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x1164ac;
      sVar4 = strlen((char *)ap_Stack_ab8);
      pfVar12 = (fdb_config *)(sVar4 + 1);
      pfStack_d60 = (fdb_config *)0x1164b8;
      sVar4 = strlen((char *)&fStack_cb8);
      pfStack_d60 = (fdb_config *)0x1164d5;
      fdb_doc_create((fdb_doc **)auStack_d48,ap_Stack_ab8,(size_t)pfVar12,(void *)0x0,0,&fStack_cb8,
                     sVar4 + 1);
      pfStack_d60 = (fdb_config *)0x1164e4;
      fVar1 = fdb_set(pfStack_d30,(fdb_doc *)auStack_d48._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001168fb;
      pfStack_d60 = (fdb_config *)0x1164f6;
      fdb_doc_free((fdb_doc *)auStack_d48._0_8_);
      uVar6 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar6;
    } while (uVar6 != 1000);
    functions_00 = ap_Stack_ab8;
    pcVar10 = "kv2";
    unaff_R13 = (char *)&fStack_cb8;
    pcVar5 = auStack_d48;
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x116535;
      sprintf((char *)functions_00,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x11654b;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116553;
      sVar4 = strlen((char *)functions_00);
      pfVar12 = (fdb_config *)(sVar4 + 1);
      pfStack_d60 = (fdb_config *)0x11655f;
      sVar4 = strlen(unaff_R13);
      pfStack_d60 = (fdb_config *)0x11657c;
      fdb_doc_create((fdb_doc **)pcVar5,functions_00,(size_t)pfVar12,(void *)0x0,0,unaff_R13,
                     sVar4 + 1);
      pfStack_d60 = (fdb_config *)0x11658b;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_d48._16_8_,(fdb_doc *)auStack_d48._0_8_);
      pcVar11 = pcVar10;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116900;
      pfStack_d60 = (fdb_config *)0x11659d;
      fdb_doc_free((fdb_doc *)auStack_d48._0_8_);
      uVar6 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_d60 = (fdb_config *)0x1165b7;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_d48._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116958;
    pfStack_d60 = (fdb_config *)0x1165c9;
    fVar1 = fdb_close((fdb_file_handle *)auStack_d48._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011695d;
    pfStack_d60 = (fdb_config *)0x1165ea;
    fVar1 = fdb_open((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",&fStack_bb0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116962;
    pfStack_d60 = (fdb_config *)0x116622;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",&fStack_bb0,
                                3,&pcStack_ce8,&p_Stack_d08,(void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116967;
    pcStack_cf8 = _multi_kv_test_keycmp;
    pfStack_d60 = (fdb_config *)0x116665;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",&fStack_bb0,
                                3,&pcStack_ce8,&p_Stack_d08,(void **)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011696c;
    pfStack_d60 = (fdb_config *)0x116683;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d28,(char *)0x0,&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116971;
    pfStack_d60 = (fdb_config *)0x1166a6;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d30,"kv1",&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116976;
    pfStack_d60 = (fdb_config *)0x1166c9;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,
                         (fdb_kvs_handle **)(auStack_d48 + 0x10),"kv2",&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011697b;
    functions_00 = ap_Stack_ab8;
    unaff_R13 = (char *)&fStack_cb8;
    pcVar5 = auStack_d48;
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x1166fb;
      sprintf((char *)functions_00,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116715;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x11671d;
      sVar4 = strlen((char *)functions_00);
      pfStack_d60 = (fdb_config *)0x11673c;
      fdb_doc_create((fdb_doc **)pcVar5,functions_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_d60 = (fdb_config *)0x11674b;
      fVar1 = fdb_get(pfStack_d28,(fdb_doc *)auStack_d48._0_8_);
      pcVar11 = (char *)auStack_d48._0_8_;
      doc_01 = (fdb_doc *)pcVar10;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116915;
      pfVar12 = *(fdb_config **)(auStack_d48._0_8_ + 0x40);
      pfStack_d60 = (fdb_config *)0x11676d;
      iVar3 = bcmp(unaff_R13,pfVar12,*(size_t *)(auStack_d48._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00116905;
      pfStack_d60 = (fdb_config *)0x11677d;
      fdb_doc_free((fdb_doc *)pcVar11);
      pfStack_d60 = (fdb_config *)0x116797;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x11679f;
      sVar4 = strlen((char *)functions_00);
      pfStack_d60 = (fdb_config *)0x1167be;
      fdb_doc_create((fdb_doc **)pcVar5,functions_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_d60 = (fdb_config *)0x1167cd;
      fVar1 = fdb_get(pfStack_d30,(fdb_doc *)auStack_d48._0_8_);
      doc_01 = (fdb_doc *)auStack_d48._0_8_;
      pcVar10 = pcVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011692a;
      pfVar12 = *(fdb_config **)(auStack_d48._0_8_ + 0x40);
      pfStack_d60 = (fdb_config *)0x1167ef;
      iVar3 = bcmp(unaff_R13,pfVar12,*(size_t *)(auStack_d48._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011691a;
      pfStack_d60 = (fdb_config *)0x1167ff;
      fdb_doc_free(doc_01);
      pfStack_d60 = (fdb_config *)0x116819;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116821;
      sVar4 = strlen((char *)functions_00);
      pfStack_d60 = (fdb_config *)0x116840;
      fdb_doc_create((fdb_doc **)pcVar5,functions_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_d60 = (fdb_config *)0x11684f;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_d48._16_8_,(fdb_doc *)auStack_d48._0_8_);
      pcVar10 = (char *)auStack_d48._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011693f;
      pfVar12 = *(fdb_config **)(auStack_d48._0_8_ + 0x40);
      pfStack_d60 = (fdb_config *)0x116871;
      iVar3 = bcmp(unaff_R13,pfVar12,*(size_t *)(auStack_d48._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_0011692f;
      pfStack_d60 = (fdb_config *)0x116881;
      fdb_doc_free((fdb_doc *)pcVar10);
      uVar6 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStack_d60 = (fdb_config *)0x116899;
    fVar1 = fdb_close((fdb_file_handle *)auStack_d48._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116980;
    pfStack_d60 = (fdb_config *)0x1168a6;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_d60 = (fdb_config *)0x1168b3;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (multi_kv_fdb_open_custom_cmp_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_d60 = (fdb_config *)0x1168e4;
      fprintf(_stderr,pcVar10,"multiple KV instances fdb_open_custom_cmp test");
      return;
    }
  }
  else {
LAB_00116944:
    pfStack_d60 = (fdb_config *)0x116949;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116949:
    pfStack_d60 = (fdb_config *)0x11694e;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011694e:
    pfStack_d60 = (fdb_config *)0x116953;
    multi_kv_fdb_open_custom_cmp_test();
    pcVar10 = (char *)doc_01;
LAB_00116953:
    pfStack_d60 = (fdb_config *)0x116958;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116958:
    pfStack_d60 = (fdb_config *)0x11695d;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011695d:
    pfStack_d60 = (fdb_config *)0x116962;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116962:
    pfStack_d60 = (fdb_config *)0x116967;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116967:
    pfStack_d60 = (fdb_config *)0x11696c;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011696c:
    pfStack_d60 = (fdb_config *)0x116971;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116971:
    pfStack_d60 = (fdb_config *)0x116976;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116976:
    pfStack_d60 = (fdb_config *)0x11697b;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011697b:
    pfStack_d60 = (fdb_config *)0x116980;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116980:
    pfStack_d60 = (fdb_config *)0x116985;
    multi_kv_fdb_open_custom_cmp_test();
  }
  pfStack_d60 = (fdb_config *)multi_kv_use_existing_mode_test;
  multi_kv_fdb_open_custom_cmp_test();
  pfStackY_10e8 = (fdb_config *)0x1169a7;
  ppcStack_d88 = kvs_names_00;
  pfStack_d80 = (fdb_doc *)pcVar10;
  pfStack_d78 = (fdb_config *)unaff_R13;
  pp_Stack_d70 = functions_00;
  pfStack_d68 = pfVar12;
  pfStack_d60 = (fdb_config *)pcVar5;
  gettimeofday(&tStack_10a0,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_1090,"rm -rf  multi_kv_test*",0x17);
  pfStackY_10e8 = (fdb_config *)0x1169c9;
  system(acStack_1090);
  pfStackY_10e8 = (fdb_config *)0x1169ce;
  memleak_start();
  pfVar9 = &fStack_f88;
  pfStackY_10e8 = (fdb_config *)0x1169de;
  fdb_get_default_config();
  pfStackY_10e8 = (fdb_config *)0x1169e8;
  fdb_get_default_kvs_config();
  fStack_f88.seqtree_opt = '\x01';
  fStack_f88.wal_threshold = 0x100;
  fStack_f88.buffercache_size = 0;
  fStack_f88.multi_kv_instances = true;
  pfStackY_10e8 = (fdb_config *)0x116a14;
  fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_multi",pfVar9);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStackY_10e8 = (fdb_config *)0x116a32;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    pfVar8 = pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ead;
    functions_00 = ap_Stack_e90;
    pfVar9 = (fdb_config *)0x0;
    do {
      pfStackY_10e8 = (fdb_config *)0x116a68;
      sprintf((char *)functions_00,"key%06d",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116a7e;
      sprintf(acStack_1090,"value%08d(%s)",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116a86;
      sVar4 = strlen((char *)functions_00);
      pfVar8 = (fdb_config *)(sVar4 + 1);
      pfStackY_10e8 = (fdb_config *)0x116a92;
      sVar4 = strlen(acStack_1090);
      pfStackY_10e8 = (fdb_config *)0x116aaf;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,(size_t)pfVar8,(void *)0x0,0,
                     acStack_1090,sVar4 + 1);
      pfStackY_10e8 = (fdb_config *)0x116abe;
      fVar1 = fdb_set(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStackY_10e8 = (fdb_config *)0x116e7f;
        multi_kv_use_existing_mode_test();
        goto LAB_00116e7f;
      }
      pfStackY_10e8 = (fdb_config *)0x116ad0;
      fdb_doc_free((fdb_doc *)pfStack_10c8);
      uVar6 = (int)pfVar9 + 1;
      pfVar9 = (fdb_config *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116aea;
    fVar1 = fdb_commit(pfStack_10d0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb2;
    pfStackY_10e8 = (fdb_config *)0x116afc;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb7;
    fStack_f88.multi_kv_instances = false;
    pfStackY_10e8 = (fdb_config *)0x116b21;
    fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_multi",&fStack_f88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ebc;
    pfStackY_10e8 = (fdb_config *)0x116b3f;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec1;
    functions_00 = ap_Stack_e90;
    pfVar9 = (fdb_config *)0x0;
    pfVar12 = pfVar8;
    do {
      pfStackY_10e8 = (fdb_config *)0x116b6e;
      sprintf((char *)functions_00,"key%06d",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116b88;
      sprintf(acStack_1090,"value%08d(%s)",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116b90;
      sVar4 = strlen((char *)functions_00);
      pfStackY_10e8 = (fdb_config *)0x116baf;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_10e8 = (fdb_config *)0x116bbe;
      fVar1 = fdb_get(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      pfVar8 = pfStack_10c8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e8c;
      pfStackY_10e8 = (fdb_config *)0x116bde;
      iVar3 = bcmp(acStack_1090,*(void **)&pfStack_10c8->multi_kv_instances,
                   pfStack_10c8->wal_threshold);
      if (iVar3 != 0) goto LAB_00116e7f;
      pfStackY_10e8 = (fdb_config *)0x116bee;
      fdb_doc_free((fdb_doc *)pfVar8);
      uVar6 = (int)pfVar9 + 1;
      pfVar9 = (fdb_config *)(ulong)uVar6;
      pfVar12 = pfVar8;
    } while (uVar6 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116c06;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec6;
    fStack_f88.multi_kv_instances = false;
    pfStackY_10e8 = (fdb_config *)0x116c2b;
    fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_single",&fStack_f88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ecb;
    pfStackY_10e8 = (fdb_config *)0x116c49;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed0;
    functions_00 = ap_Stack_e90;
    pfVar9 = (fdb_config *)0x0;
    do {
      pfStackY_10e8 = (fdb_config *)0x116c7f;
      sprintf((char *)functions_00,"key%06d",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116c95;
      sprintf(acStack_1090,"value%08d(%s)",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116c9d;
      sVar4 = strlen((char *)functions_00);
      pfVar8 = (fdb_config *)(sVar4 + 1);
      pfStackY_10e8 = (fdb_config *)0x116ca9;
      sVar4 = strlen(acStack_1090);
      pfStackY_10e8 = (fdb_config *)0x116cc6;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,(size_t)pfVar8,(void *)0x0,0,
                     acStack_1090,sVar4 + 1);
      pfStackY_10e8 = (fdb_config *)0x116cd5;
      fVar1 = fdb_set(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e91;
      pfStackY_10e8 = (fdb_config *)0x116ce7;
      fdb_doc_free((fdb_doc *)pfStack_10c8);
      uVar6 = (int)pfVar9 + 1;
      pfVar9 = (fdb_config *)(ulong)uVar6;
    } while (uVar6 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116d01;
    fVar1 = fdb_commit(pfStack_10d0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed5;
    pfStackY_10e8 = (fdb_config *)0x116d13;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eda;
    fStack_f88.multi_kv_instances = true;
    pfStackY_10e8 = (fdb_config *)0x116d38;
    fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_single",&fStack_f88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116edf;
    pfStackY_10e8 = (fdb_config *)0x116d56;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ee4;
    functions_00 = ap_Stack_e90;
    pfVar9 = (fdb_config *)0x0;
    pfVar12 = pfVar8;
    do {
      pfStackY_10e8 = (fdb_config *)0x116d85;
      sprintf((char *)functions_00,"key%06d",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116d9f;
      sprintf(acStack_1090,"value%08d(%s)",pfVar9);
      pfStackY_10e8 = (fdb_config *)0x116da7;
      sVar4 = strlen((char *)functions_00);
      pfStackY_10e8 = (fdb_config *)0x116dc6;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_10e8 = (fdb_config *)0x116dd5;
      fVar1 = fdb_get(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      pfVar8 = pfStack_10c8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ea3;
      pfStackY_10e8 = (fdb_config *)0x116df5;
      iVar3 = bcmp(acStack_1090,*(void **)&pfStack_10c8->multi_kv_instances,
                   pfStack_10c8->wal_threshold);
      if (iVar3 != 0) goto LAB_00116e96;
      pfStackY_10e8 = (fdb_config *)0x116e05;
      fdb_doc_free((fdb_doc *)pfVar8);
      uVar6 = (int)pfVar9 + 1;
      pfVar9 = (fdb_config *)(ulong)uVar6;
      pfVar12 = pfVar8;
    } while (uVar6 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116e1d;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_10e8 = (fdb_config *)0x116e2a;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pfStackY_10e8 = (fdb_config *)0x116e37;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (multi_kv_use_existing_mode_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStackY_10e8 = (fdb_config *)0x116e68;
        fprintf(_stderr,pcVar10,"multiple KV instances use existing mode test");
        return;
      }
      goto LAB_00116eee;
    }
  }
  else {
LAB_00116ea8:
    pfStackY_10e8 = (fdb_config *)0x116ead;
    multi_kv_use_existing_mode_test();
    pfVar8 = pfVar12;
LAB_00116ead:
    pfStackY_10e8 = (fdb_config *)0x116eb2;
    multi_kv_use_existing_mode_test();
LAB_00116eb2:
    pfStackY_10e8 = (fdb_config *)0x116eb7;
    multi_kv_use_existing_mode_test();
LAB_00116eb7:
    pfStackY_10e8 = (fdb_config *)0x116ebc;
    multi_kv_use_existing_mode_test();
LAB_00116ebc:
    pfStackY_10e8 = (fdb_config *)0x116ec1;
    multi_kv_use_existing_mode_test();
LAB_00116ec1:
    pfStackY_10e8 = (fdb_config *)0x116ec6;
    multi_kv_use_existing_mode_test();
LAB_00116ec6:
    pfStackY_10e8 = (fdb_config *)0x116ecb;
    multi_kv_use_existing_mode_test();
LAB_00116ecb:
    pfStackY_10e8 = (fdb_config *)0x116ed0;
    multi_kv_use_existing_mode_test();
LAB_00116ed0:
    pfStackY_10e8 = (fdb_config *)0x116ed5;
    multi_kv_use_existing_mode_test();
LAB_00116ed5:
    pfStackY_10e8 = (fdb_config *)0x116eda;
    multi_kv_use_existing_mode_test();
LAB_00116eda:
    pfStackY_10e8 = (fdb_config *)0x116edf;
    multi_kv_use_existing_mode_test();
LAB_00116edf:
    pfStackY_10e8 = (fdb_config *)0x116ee4;
    multi_kv_use_existing_mode_test();
LAB_00116ee4:
    pfStackY_10e8 = (fdb_config *)0x116ee9;
    multi_kv_use_existing_mode_test();
  }
  pfStackY_10e8 = (fdb_config *)0x116eee;
  multi_kv_use_existing_mode_test();
LAB_00116eee:
  pfStackY_10e8 = (fdb_config *)_opening_thread;
  multi_kv_use_existing_mode_test();
  pfStackY_10f8 = pfVar9;
  pp_StackY_10f0 = functions_00;
  pfStackY_10e8 = pfVar8;
  fdb_get_default_config();
  lVar13 = 0;
  gettimeofday(&tStackY_1520,(__timezone_ptr_t)0x0);
  do {
    fVar1 = fdb_open((fdb_file_handle **)((long)apfStackY_1418 + lVar13),"multi_kv_test2",
                     &fStackY_1510);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x92d);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x92d,"void *_opening_thread(void *)");
    }
    lVar13 = lVar13 + 8;
  } while (lVar13 != 800);
  lVar13 = 0;
  do {
    fVar1 = fdb_close(apfStackY_1418[lVar13]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x931);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x931,"void *_opening_thread(void *)");
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 100);
  pthread_exit((void *)0x0);
}

Assistant:

void multi_kv_rollback_test(uint8_t opt, size_t chunksize)
{
    TEST_INIT();

    int n = 100;
    int i, r;
    char key[256], value[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_seqnum_t seq1, seq2, seq3;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s;

    char *kvs_names[] = {NULL, (char*)"kv1", (char*)"kv2"};
    fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp};

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.chunksize = chunksize;
    config.multi_kv_instances = true;
    config.wal_threshold = 1000;
    config.buffercache_size = 0;
    // for rollback, disable block reusing
    config.block_reusing_threshold = 0;

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents first time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv1, &seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents second time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(db, &seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv2, &seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // rollback kv1 using seq1
    s = fdb_rollback(&kv1, seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq2
    s = fdb_rollback(&db, seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq3
    s = fdb_rollback(&kv2, seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & re-open
    s = fdb_kvs_close(kv1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(kv2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);

    // retrieve check after re-open
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();

    if (opt & MULTI_KV_VAR_CMP) {
        TEST_RESULT("multiple KV instances rollback test "
                    "(custom key order)");
    } else {
        TEST_RESULT("multiple KV instances rollback test");
    }
}